

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disflow_sse4.c
# Opt level: O1

void aom_compute_flow_at_point_sse4_1
               (uint8_t *src,uint8_t *ref,int x,int y,int width,int height,int stride,double *u,
               double *v)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  ulong uVar3;
  int iVar4;
  long lVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  undefined1 (*pauVar9) [16];
  int iVar10;
  uint8_t *puVar11;
  short sVar12;
  short sVar21;
  short sVar22;
  short sVar23;
  short sVar24;
  short sVar27;
  short sVar28;
  undefined1 auVar13 [16];
  short sVar29;
  double dVar25;
  double dVar26;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar20 [16];
  double dVar30;
  undefined1 in_XMM1 [16];
  undefined1 auVar31 [16];
  short sVar32;
  short sVar37;
  double dVar33;
  short sVar35;
  short sVar36;
  short sVar38;
  short sVar39;
  short sVar40;
  undefined1 auVar34 [16];
  short sVar41;
  undefined4 uVar42;
  double dVar43;
  undefined4 uVar51;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  double dVar52;
  undefined1 auVar47 [16];
  undefined4 uVar50;
  undefined4 uVar53;
  undefined1 auVar49 [16];
  double dVar54;
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  double dVar62;
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  double dVar63;
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  short sVar67;
  short sVar69;
  short sVar70;
  short sVar71;
  short sVar72;
  short sVar73;
  short sVar74;
  short sVar75;
  undefined1 auVar68 [16];
  undefined1 in_XMM9 [16];
  undefined1 in_XMM10 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  double dVar79;
  double dVar83;
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  int16_t dy [64];
  int16_t dx [64];
  undefined1 auStack_1e8 [16];
  undefined2 auStack_1d8 [8];
  undefined1 auStack_1c8 [16];
  undefined2 auStack_1b8 [64];
  short asStack_138 [64];
  short asStack_b8 [68];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar48 [16];
  undefined1 auVar59 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  
  auVar2 = _DAT_00510060;
  auVar1 = _DAT_0050f7d0;
  uVar3 = (ulong)stride;
  lVar5 = (long)(stride * y + x);
  auVar34 = *(undefined1 (*) [16])(src + ~uVar3 + lVar5);
  auVar31 = pmovzxbw(in_XMM1,auVar34);
  auVar13 = pmovzxbw(auVar34 >> 8,auVar34 >> 8);
  auVar34 = pmovzxbw(auVar34 >> 0x10,auVar34 >> 0x10);
  auVar56._0_2_ = auVar31._0_2_ + auVar34._0_2_;
  auVar56._2_2_ = auVar31._2_2_ + auVar34._2_2_;
  auVar56._4_2_ = auVar31._4_2_ + auVar34._4_2_;
  auVar56._6_2_ = auVar31._6_2_ + auVar34._6_2_;
  auVar56._8_2_ = auVar31._8_2_ + auVar34._8_2_;
  auVar56._10_2_ = auVar31._10_2_ + auVar34._10_2_;
  auVar56._12_2_ = auVar31._12_2_ + auVar34._12_2_;
  auVar56._14_2_ = auVar31._14_2_ + auVar34._14_2_;
  auVar45._0_2_ = auVar31._0_2_ - auVar34._0_2_;
  auVar45._2_2_ = auVar31._2_2_ - auVar34._2_2_;
  auVar45._4_2_ = auVar31._4_2_ - auVar34._4_2_;
  auVar45._6_2_ = auVar31._6_2_ - auVar34._6_2_;
  auVar45._8_2_ = auVar31._8_2_ - auVar34._8_2_;
  auVar45._10_2_ = auVar31._10_2_ - auVar34._10_2_;
  auVar45._12_2_ = auVar31._12_2_ - auVar34._12_2_;
  auVar45._14_2_ = auVar31._14_2_ - auVar34._14_2_;
  auVar34 = *(undefined1 (*) [16])(src + lVar5 + -1);
  auVar44 = pmovzxbw(auVar56,auVar34);
  auVar31 = pmovzxbw(auVar34 >> 8,auVar34 >> 8);
  auVar55 = pmovzxbw(auVar34 >> 0x10,auVar34 >> 0x10);
  auVar34._0_2_ = auVar44._0_2_ - auVar55._0_2_;
  auVar34._2_2_ = auVar44._2_2_ - auVar55._2_2_;
  auVar34._4_2_ = auVar44._4_2_ - auVar55._4_2_;
  auVar34._6_2_ = auVar44._6_2_ - auVar55._6_2_;
  auVar34._8_2_ = auVar44._8_2_ - auVar55._8_2_;
  auVar34._10_2_ = auVar44._10_2_ - auVar55._10_2_;
  auVar34._12_2_ = auVar44._12_2_ - auVar55._12_2_;
  auVar34._14_2_ = auVar44._14_2_ - auVar55._14_2_;
  pauVar9 = (undefined1 (*) [16])(src + (long)(stride * y) + uVar3 + (long)x + -1);
  lVar5 = 0;
  sVar12 = auVar13._0_2_ * 2 + auVar56._0_2_;
  sVar21 = auVar13._2_2_ * 2 + auVar56._2_2_;
  sVar22 = auVar13._4_2_ * 2 + auVar56._4_2_;
  sVar23 = auVar13._6_2_ * 2 + auVar56._6_2_;
  sVar24 = auVar13._8_2_ * 2 + auVar56._8_2_;
  sVar27 = auVar13._10_2_ * 2 + auVar56._10_2_;
  sVar28 = auVar13._12_2_ * 2 + auVar56._12_2_;
  sVar29 = auVar13._14_2_ * 2 + auVar56._14_2_;
  sVar32 = auVar31._0_2_ * 2 + auVar44._0_2_ + auVar55._0_2_;
  sVar35 = auVar31._2_2_ * 2 + auVar44._2_2_ + auVar55._2_2_;
  sVar36 = auVar31._4_2_ * 2 + auVar44._4_2_ + auVar55._4_2_;
  sVar37 = auVar31._6_2_ * 2 + auVar44._6_2_ + auVar55._6_2_;
  sVar38 = auVar31._8_2_ * 2 + auVar44._8_2_ + auVar55._8_2_;
  sVar39 = auVar31._10_2_ * 2 + auVar44._10_2_ + auVar55._10_2_;
  sVar40 = auVar31._12_2_ * 2 + auVar44._12_2_ + auVar55._12_2_;
  sVar41 = auVar31._14_2_ * 2 + auVar44._14_2_ + auVar55._14_2_;
  do {
    auVar13 = *pauVar9;
    auVar31 = pmovzxbw(auVar34,auVar13);
    auVar44 = pmovzxbw(auVar13 >> 8,auVar13 >> 8);
    auVar56 = pmovzxbw(auVar13 >> 0x10,auVar13 >> 0x10);
    sVar67 = auVar44._0_2_ * 2 + auVar31._0_2_ + auVar56._0_2_;
    sVar69 = auVar44._2_2_ * 2 + auVar31._2_2_ + auVar56._2_2_;
    sVar70 = auVar44._4_2_ * 2 + auVar31._4_2_ + auVar56._4_2_;
    sVar71 = auVar44._6_2_ * 2 + auVar31._6_2_ + auVar56._6_2_;
    sVar72 = auVar44._8_2_ * 2 + auVar31._8_2_ + auVar56._8_2_;
    sVar73 = auVar44._10_2_ * 2 + auVar31._10_2_ + auVar56._10_2_;
    sVar74 = auVar44._12_2_ * 2 + auVar31._12_2_ + auVar56._12_2_;
    sVar75 = auVar44._14_2_ * 2 + auVar31._14_2_ + auVar56._14_2_;
    auVar13._0_2_ = auVar31._0_2_ - auVar56._0_2_;
    auVar13._2_2_ = auVar31._2_2_ - auVar56._2_2_;
    auVar13._4_2_ = auVar31._4_2_ - auVar56._4_2_;
    auVar13._6_2_ = auVar31._6_2_ - auVar56._6_2_;
    auVar13._8_2_ = auVar31._8_2_ - auVar56._8_2_;
    auVar13._10_2_ = auVar31._10_2_ - auVar56._10_2_;
    auVar13._12_2_ = auVar31._12_2_ - auVar56._12_2_;
    auVar13._14_2_ = auVar31._14_2_ - auVar56._14_2_;
    *(short *)((long)asStack_b8 + lVar5) = auVar34._0_2_ * 2 + auVar45._0_2_ + auVar13._0_2_;
    *(short *)((long)asStack_b8 + lVar5 + 2) = auVar34._2_2_ * 2 + auVar45._2_2_ + auVar13._2_2_;
    *(short *)((long)asStack_b8 + lVar5 + 4) = auVar34._4_2_ * 2 + auVar45._4_2_ + auVar13._4_2_;
    *(short *)((long)asStack_b8 + lVar5 + 6) = auVar34._6_2_ * 2 + auVar45._6_2_ + auVar13._6_2_;
    *(short *)((long)asStack_b8 + lVar5 + 8) = auVar34._8_2_ * 2 + auVar45._8_2_ + auVar13._8_2_;
    *(short *)((long)asStack_b8 + lVar5 + 10) = auVar34._10_2_ * 2 + auVar45._10_2_ + auVar13._10_2_
    ;
    *(short *)((long)asStack_b8 + lVar5 + 0xc) =
         auVar34._12_2_ * 2 + auVar45._12_2_ + auVar13._12_2_;
    *(short *)((long)asStack_b8 + lVar5 + 0xe) =
         auVar34._14_2_ * 2 + auVar45._14_2_ + auVar13._14_2_;
    *(short *)((long)asStack_138 + lVar5) = sVar12 - sVar67;
    *(short *)((long)asStack_138 + lVar5 + 2) = sVar21 - sVar69;
    *(short *)((long)asStack_138 + lVar5 + 4) = sVar22 - sVar70;
    *(short *)((long)asStack_138 + lVar5 + 6) = sVar23 - sVar71;
    *(short *)((long)asStack_138 + lVar5 + 8) = sVar24 - sVar72;
    *(short *)((long)asStack_138 + lVar5 + 10) = sVar27 - sVar73;
    *(short *)((long)asStack_138 + lVar5 + 0xc) = sVar28 - sVar74;
    *(short *)((long)asStack_138 + lVar5 + 0xe) = sVar29 - sVar75;
    lVar5 = lVar5 + 0x10;
    pauVar9 = (undefined1 (*) [16])(*pauVar9 + uVar3);
    auVar45 = auVar34;
    auVar34 = auVar13;
    sVar12 = sVar32;
    sVar21 = sVar35;
    sVar22 = sVar36;
    sVar23 = sVar37;
    sVar24 = sVar38;
    sVar27 = sVar39;
    sVar28 = sVar40;
    sVar29 = sVar41;
    sVar32 = sVar67;
    sVar35 = sVar69;
    sVar36 = sVar70;
    sVar37 = sVar71;
    sVar38 = sVar72;
    sVar39 = sVar73;
    sVar40 = sVar74;
    sVar41 = sVar75;
  } while (lVar5 != 0x80);
  lVar5 = 0;
  auVar34 = (undefined1  [16])0x0;
  auVar45 = (undefined1  [16])0x0;
  auVar13 = (undefined1  [16])0x0;
  do {
    auVar31 = *(undefined1 (*) [16])((long)asStack_b8 + lVar5);
    auVar56 = *(undefined1 (*) [16])((long)asStack_138 + lVar5);
    auVar55 = pmaddwd(auVar31,auVar31);
    auVar44._0_4_ = auVar45._0_4_ + auVar55._0_4_;
    auVar44._4_4_ = auVar45._4_4_ + auVar55._4_4_;
    auVar44._8_4_ = auVar45._8_4_ + auVar55._8_4_;
    auVar44._12_4_ = auVar45._12_4_ + auVar55._12_4_;
    auVar45 = pmaddwd(auVar31,auVar56);
    auVar55._0_4_ = auVar13._0_4_ + auVar45._0_4_;
    auVar55._4_4_ = auVar13._4_4_ + auVar45._4_4_;
    auVar55._8_4_ = auVar13._8_4_ + auVar45._8_4_;
    auVar55._12_4_ = auVar13._12_4_ + auVar45._12_4_;
    auVar45 = pmaddwd(auVar56,auVar56);
    auVar31._0_4_ = auVar34._0_4_ + auVar45._0_4_;
    auVar31._4_4_ = auVar34._4_4_ + auVar45._4_4_;
    auVar31._8_4_ = auVar34._8_4_ + auVar45._8_4_;
    auVar31._12_4_ = auVar34._12_4_ + auVar45._12_4_;
    lVar5 = lVar5 + 0x10;
    auVar34 = auVar31;
    auVar45 = auVar44;
    auVar13 = auVar55;
  } while (lVar5 != 0x80);
  auVar34 = phaddd(auVar44,auVar55);
  auVar45 = phaddd(auVar55,auVar31);
  auVar34 = phaddd(auVar34,auVar45);
  dVar33 = (double)(auVar34._0_4_ + 1);
  dVar25 = (double)(auVar34._12_4_ + 1);
  dVar63 = 1.0 / (dVar25 * dVar33 - (double)auVar34._8_4_ * (double)auVar34._4_4_);
  auVar20._0_8_ = -(double)auVar34._8_4_;
  auVar20._8_8_ = -dVar25;
  dVar26 = auVar20._0_8_ * dVar63;
  iVar4 = 0;
  auVar45 = pmovzxbd(in_XMM9,0x80808080);
  auVar13 = pmovsxbw(in_XMM10,0x100010001000100);
  do {
    dVar30 = *u;
    auVar46._8_8_ = *v;
    auVar46._0_8_ = dVar30;
    auVar56 = roundpd(auVar20,auVar46,9);
    dVar43 = dVar30 - auVar56._0_8_;
    dVar52 = *v - auVar56._8_8_;
    dVar79 = dVar43 * dVar43;
    dVar83 = dVar52 * dVar52;
    dVar54 = dVar43 * dVar79 * 0.5;
    dVar62 = dVar52 * dVar83 * 0.5;
    auVar76._0_8_ = dVar43 * dVar79 * 1.5;
    auVar76._8_8_ = dVar52 * dVar83 * 1.5;
    auVar81._0_8_ = dVar79 * 0.5;
    auVar81._8_8_ = dVar83 * 0.5;
    auVar89._0_8_ = ((dVar79 - dVar43 * 0.5) - dVar54) * 16384.0;
    auVar89._8_8_ = ((dVar83 - dVar52 * 0.5) - dVar62) * 16384.0;
    auVar31 = roundpd(auVar89,auVar89,8);
    auVar84._0_8_ = (dVar79 * -2.5 + 1.0 + auVar76._0_8_) * 16384.0;
    auVar84._8_8_ = (dVar83 * -2.5 + 1.0 + auVar76._8_8_) * 16384.0;
    auVar55 = roundpd(auVar76,auVar84,8);
    auVar64._0_8_ = ((dVar79 + dVar79 + dVar43 * 0.5) - auVar76._0_8_) * 16384.0;
    auVar64._8_8_ = ((dVar83 + dVar83 + dVar52 * 0.5) - auVar76._8_8_) * 16384.0;
    auVar44 = roundpd(auVar64,auVar64,8);
    auVar57._0_8_ = (dVar54 - auVar81._0_8_) * 16384.0;
    auVar57._8_8_ = (dVar62 - auVar81._8_8_) * 16384.0;
    auVar47._0_4_ = (int)auVar31._0_8_;
    auVar48._4_4_ = (int)auVar31._8_8_;
    auVar48._0_4_ = auVar47._0_4_;
    auVar31 = roundpd(auVar31,auVar57,8);
    auVar48._8_4_ = auVar48._4_4_;
    auVar48._12_4_ = (int)auVar55._8_8_;
    auVar47._8_8_ = auVar48._8_8_;
    auVar47._4_4_ = (int)auVar55._0_8_;
    auVar58._0_4_ = (int)auVar44._0_8_;
    auVar59._4_4_ = (int)auVar44._8_8_;
    auVar59._0_4_ = auVar58._0_4_;
    auVar59._8_4_ = auVar59._4_4_;
    auVar59._12_4_ = (int)auVar31._8_8_;
    auVar58._8_8_ = auVar59._8_8_;
    auVar58._4_4_ = (int)auVar31._0_8_;
    iVar10 = (int)auVar56._0_8_ + x;
    iVar8 = width;
    if (iVar10 < width) {
      iVar8 = iVar10;
    }
    iVar8 = iVar8 + -1;
    iVar7 = (int)auVar56._8_8_ + y;
    iVar6 = height;
    if (iVar7 < height) {
      iVar6 = iVar7;
    }
    auVar31 = packssdw(auVar47,auVar58);
    if (iVar7 < -9) {
      iVar6 = -9;
    }
    if (iVar10 < -9) {
      iVar8 = -10;
    }
    uVar42 = auVar31._0_4_;
    uVar50 = auVar31._4_4_;
    uVar51 = auVar31._8_4_;
    uVar53 = auVar31._12_4_;
    auVar60._4_4_ = uVar42;
    auVar60._0_4_ = uVar42;
    auVar60._8_4_ = uVar42;
    auVar60._12_4_ = uVar42;
    auVar65._4_4_ = uVar51;
    auVar65._0_4_ = uVar51;
    auVar65._8_4_ = uVar51;
    auVar65._12_4_ = uVar51;
    pauVar9 = (undefined1 (*) [16])(ref + ((long)iVar6 + -1) * uVar3 + (long)iVar8);
    lVar5 = 0;
    do {
      auVar31 = *pauVar9;
      auVar44 = pmovzxbw(auVar81,auVar31);
      auVar14._8_4_ = auVar31._8_4_;
      auVar14._12_4_ = auVar31._12_4_;
      auVar14._0_8_ = auVar31._4_8_;
      auVar31 = pmovzxbw(auVar14,auVar14);
      auVar56 = pshufb(auVar44,auVar1);
      auVar44 = pshufb(auVar44,auVar2);
      auVar56 = pmaddwd(auVar56,auVar60);
      auVar44 = pmaddwd(auVar44,auVar65);
      auVar80._0_4_ = auVar44._0_4_ + auVar56._0_4_ + auVar45._0_4_ >> 8;
      auVar80._4_4_ = auVar44._4_4_ + auVar56._4_4_ + auVar45._4_4_ >> 8;
      auVar80._8_4_ = auVar44._8_4_ + auVar56._8_4_ + auVar45._8_4_ >> 8;
      auVar80._12_4_ = auVar44._12_4_ + auVar56._12_4_ + auVar45._12_4_ >> 8;
      auVar56 = pshufb(auVar31,auVar1);
      auVar31 = pshufb(auVar31,auVar2);
      auVar56 = pmaddwd(auVar56,auVar60);
      auVar31 = pmaddwd(auVar31,auVar65);
      auVar15._0_4_ = auVar31._0_4_ + auVar56._0_4_ + auVar45._0_4_ >> 8;
      auVar15._4_4_ = auVar31._4_4_ + auVar56._4_4_ + auVar45._4_4_ >> 8;
      auVar15._8_4_ = auVar31._8_4_ + auVar56._8_4_ + auVar45._8_4_ >> 8;
      auVar15._12_4_ = auVar31._12_4_ + auVar56._12_4_ + auVar45._12_4_ >> 8;
      auVar81 = packssdw(auVar80,auVar15);
      *(undefined1 (*) [16])(auStack_1e8 + lVar5) = auVar81;
      lVar5 = lVar5 + 0x10;
      pauVar9 = (undefined1 (*) [16])(*pauVar9 + uVar3);
    } while (lVar5 != 0xb0);
    auVar61._4_4_ = uVar50;
    auVar61._0_4_ = uVar50;
    auVar61._8_4_ = uVar50;
    auVar61._12_4_ = uVar50;
    auVar66._4_4_ = uVar53;
    auVar66._0_4_ = uVar53;
    auVar66._8_4_ = uVar53;
    auVar66._12_4_ = uVar53;
    lVar5 = 0;
    puVar11 = src + (long)y * uVar3 + (long)x;
    auVar31 = (undefined1  [16])0x0;
    auVar56 = (undefined1  [16])0x0;
    do {
      auVar44 = *(undefined1 (*) [16])(auStack_1e8 + lVar5);
      auVar55 = *(undefined1 (*) [16])(auStack_1c8 + lVar5);
      auVar19._0_12_ = auVar44._0_12_;
      auVar19._12_2_ = auVar44._6_2_;
      auVar19._14_2_ = *(undefined2 *)((long)auStack_1d8 + lVar5 + 6);
      auVar18._12_4_ = auVar19._12_4_;
      auVar18._0_10_ = auVar44._0_10_;
      auVar18._10_2_ = *(undefined2 *)((long)auStack_1d8 + lVar5 + 4);
      auVar17._10_6_ = auVar18._10_6_;
      auVar17._0_8_ = auVar44._0_8_;
      auVar17._8_2_ = auVar44._4_2_;
      auVar16._8_8_ = auVar17._8_8_;
      auVar16._6_2_ = *(undefined2 *)((long)auStack_1d8 + lVar5 + 2);
      auVar16._4_2_ = auVar44._2_2_;
      auVar16._0_2_ = auVar44._0_2_;
      auVar16._2_2_ = *(undefined2 *)((long)auStack_1d8 + lVar5);
      auVar20 = pmaddwd(auVar16,auVar61);
      auVar88._0_12_ = auVar55._0_12_;
      auVar88._12_2_ = auVar55._6_2_;
      auVar88._14_2_ = *(undefined2 *)((long)auStack_1b8 + lVar5 + 6);
      auVar87._12_4_ = auVar88._12_4_;
      auVar87._0_10_ = auVar55._0_10_;
      auVar87._10_2_ = *(undefined2 *)((long)auStack_1b8 + lVar5 + 4);
      auVar86._10_6_ = auVar87._10_6_;
      auVar86._0_8_ = auVar55._0_8_;
      auVar86._8_2_ = auVar55._4_2_;
      auVar85._8_8_ = auVar86._8_8_;
      auVar85._6_2_ = *(undefined2 *)((long)auStack_1b8 + lVar5 + 2);
      auVar85._4_2_ = auVar55._2_2_;
      auVar85._0_2_ = auVar55._0_2_;
      auVar85._2_2_ = *(undefined2 *)((long)auStack_1b8 + lVar5);
      auVar89 = pmaddwd(auVar85,auVar66);
      auVar68._2_2_ = *(undefined2 *)((long)auStack_1d8 + lVar5 + 8);
      auVar68._0_2_ = auVar44._8_2_;
      auVar68._4_2_ = auVar44._10_2_;
      auVar68._6_2_ = *(undefined2 *)((long)auStack_1d8 + lVar5 + 10);
      auVar68._8_2_ = auVar44._12_2_;
      auVar68._10_2_ = *(undefined2 *)((long)auStack_1d8 + lVar5 + 0xc);
      auVar68._12_2_ = auVar44._14_2_;
      auVar68._14_2_ = *(undefined2 *)(auStack_1c8 + lVar5 + -2);
      auVar44 = pmaddwd(auVar68,auVar61);
      auVar77._2_2_ = *(undefined2 *)((long)auStack_1b8 + lVar5 + 8);
      auVar77._0_2_ = auVar55._8_2_;
      auVar77._4_2_ = auVar55._10_2_;
      auVar77._6_2_ = *(undefined2 *)((long)auStack_1b8 + lVar5 + 10);
      auVar77._8_2_ = auVar55._12_2_;
      auVar77._10_2_ = *(undefined2 *)((long)auStack_1b8 + lVar5 + 0xc);
      auVar77._12_2_ = auVar55._14_2_;
      auVar77._14_2_ = *(undefined2 *)((long)auStack_1b8 + lVar5 + 0xe);
      auVar55 = pmaddwd(auVar77,auVar66);
      auVar90._0_4_ = auVar89._0_4_ + auVar20._0_4_ + auVar13._0_4_ >> 0x11;
      auVar90._4_4_ = auVar89._4_4_ + auVar20._4_4_ + auVar13._4_4_ >> 0x11;
      auVar90._8_4_ = auVar89._8_4_ + auVar20._8_4_ + auVar13._8_4_ >> 0x11;
      auVar90._12_4_ = auVar89._12_4_ + auVar20._12_4_ + auVar13._12_4_ >> 0x11;
      auVar78._0_4_ = auVar55._0_4_ + auVar44._0_4_ + auVar13._0_4_ >> 0x11;
      auVar78._4_4_ = auVar55._4_4_ + auVar44._4_4_ + auVar13._4_4_ >> 0x11;
      auVar78._8_4_ = auVar55._8_4_ + auVar44._8_4_ + auVar13._8_4_ >> 0x11;
      auVar78._12_4_ = auVar55._12_4_ + auVar44._12_4_ + auVar13._12_4_ >> 0x11;
      auVar44 = pmovzxbw(auVar20,*(undefined8 *)puVar11);
      auVar55 = packssdw(auVar90,auVar78);
      auVar44 = psllw(auVar44,3);
      auVar91._0_2_ = auVar55._0_2_ - auVar44._0_2_;
      auVar91._2_2_ = auVar55._2_2_ - auVar44._2_2_;
      auVar91._4_2_ = auVar55._4_2_ - auVar44._4_2_;
      auVar91._6_2_ = auVar55._6_2_ - auVar44._6_2_;
      auVar91._8_2_ = auVar55._8_2_ - auVar44._8_2_;
      auVar91._10_2_ = auVar55._10_2_ - auVar44._10_2_;
      auVar91._12_2_ = auVar55._12_2_ - auVar44._12_2_;
      auVar91._14_2_ = auVar55._14_2_ - auVar44._14_2_;
      auVar44 = pmaddwd(*(undefined1 (*) [16])((long)asStack_b8 + lVar5),auVar91);
      auVar49._0_4_ = auVar31._0_4_ + auVar44._0_4_;
      auVar49._4_4_ = auVar31._4_4_ + auVar44._4_4_;
      auVar49._8_4_ = auVar31._8_4_ + auVar44._8_4_;
      auVar49._12_4_ = auVar31._12_4_ + auVar44._12_4_;
      auVar31 = pmaddwd(auVar91,*(undefined1 (*) [16])((long)asStack_138 + lVar5));
      auVar82._0_4_ = auVar56._0_4_ + auVar31._0_4_;
      auVar82._4_4_ = auVar56._4_4_ + auVar31._4_4_;
      auVar82._8_4_ = auVar56._8_4_ + auVar31._8_4_;
      auVar82._12_4_ = auVar56._12_4_ + auVar31._12_4_;
      lVar5 = lVar5 + 0x10;
      puVar11 = puVar11 + uVar3;
      auVar31 = auVar49;
      auVar56 = auVar82;
    } while (lVar5 != 0x80);
    auVar31 = phaddd(auVar49,auVar82);
    auVar31 = phaddd(auVar31,auVar31);
    dVar52 = (double)auVar31._0_4_ * dVar25 * dVar63 +
             (double)auVar31._12_4_ * -(double)auVar34._4_4_ * dVar63;
    dVar54 = (double)auVar31._0_4_ * dVar26 + (double)auVar31._12_4_ * dVar33 * dVar63;
    auVar20 = ZEXT816(0x4000000000000000);
    dVar43 = 2.0;
    if (dVar52 <= 2.0) {
      dVar43 = dVar52;
    }
    *u = dVar30 + (double)(-(ulong)(dVar52 < -2.0) & 0xc000000000000000 |
                          ~-(ulong)(dVar52 < -2.0) & (ulong)dVar43);
    dVar30 = 2.0;
    if (dVar54 <= 2.0) {
      dVar30 = dVar54;
    }
    *v = (double)(-(ulong)(dVar54 < -2.0) & 0xc000000000000000 |
                 ~-(ulong)(dVar54 < -2.0) & (ulong)dVar30) + *v;
  } while ((0.125 <= ABS(dVar52) + ABS(dVar54)) && (iVar4 = iVar4 + 1, iVar4 != 4));
  return;
}

Assistant:

void aom_compute_flow_at_point_sse4_1(const uint8_t *src, const uint8_t *ref,
                                      int x, int y, int width, int height,
                                      int stride, double *u, double *v) {
  DECLARE_ALIGNED(16, double, M[4]);
  DECLARE_ALIGNED(16, double, M_inv[4]);
  DECLARE_ALIGNED(16, int16_t, dx[DISFLOW_PATCH_SIZE * DISFLOW_PATCH_SIZE]);
  DECLARE_ALIGNED(16, int16_t, dy[DISFLOW_PATCH_SIZE * DISFLOW_PATCH_SIZE]);
  int b[2];

  // Compute gradients within this patch
  const uint8_t *src_patch = &src[y * stride + x];
  sobel_filter(src_patch, stride, dx, dy);

  compute_flow_matrix(dx, DISFLOW_PATCH_SIZE, dy, DISFLOW_PATCH_SIZE, M);
  invert_2x2(M, M_inv);

  for (int itr = 0; itr < DISFLOW_MAX_ITR; itr++) {
    compute_flow_vector(src, ref, width, height, stride, x, y, *u, *v, dx, dy,
                        b);

    // Solve flow equations to find a better estimate for the flow vector
    // at this point
    const double step_u = M_inv[0] * b[0] + M_inv[1] * b[1];
    const double step_v = M_inv[2] * b[0] + M_inv[3] * b[1];
    *u += fclamp(step_u * DISFLOW_STEP_SIZE, -2, 2);
    *v += fclamp(step_v * DISFLOW_STEP_SIZE, -2, 2);

    if (fabs(step_u) + fabs(step_v) < DISFLOW_STEP_SIZE_THRESOLD) {
      // Stop iteration when we're close to convergence
      break;
    }
  }
}